

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_291950::ArgParser::initOptionTables(ArgParser *this)

{
  anon_class_1_0_00000001 local_3339;
  bare_arg_handler_t local_3338;
  allocator<char> local_3311;
  string local_3310;
  anon_class_8_1_8991fb9c local_32f0;
  bare_arg_handler_t local_32e8;
  code *local_32c8;
  undefined8 local_32c0;
  param_arg_handler_t local_32b8;
  code *local_3298;
  undefined8 local_3290;
  bare_arg_handler_t local_3288;
  allocator<char> local_3261;
  string local_3260;
  anon_class_8_1_8991fb9c local_3240;
  param_arg_handler_t local_3238;
  allocator<char> local_3211;
  string local_3210;
  anon_class_8_1_8991fb9c local_31f0;
  param_arg_handler_t local_31e8;
  allocator<char> local_31c1;
  string local_31c0;
  code *local_31a0;
  undefined8 local_3198;
  param_arg_handler_t local_3190;
  code *local_3170;
  undefined8 local_3168;
  bare_arg_handler_t local_3160;
  allocator<char> local_3139;
  string local_3138;
  anon_class_8_1_8991fb9c local_3118;
  param_arg_handler_t local_3110;
  allocator<char> local_30e9;
  string local_30e8;
  anon_class_8_1_8991fb9c local_30c8;
  param_arg_handler_t local_30c0;
  allocator<char> local_3099;
  string local_3098;
  anon_class_8_1_8991fb9c local_3078;
  param_arg_handler_t local_3070;
  allocator<char> local_3049;
  string local_3048;
  anon_class_8_1_8991fb9c local_3028;
  param_arg_handler_t local_3020;
  allocator<char> local_2ff9;
  string local_2ff8;
  anon_class_8_1_8991fb9c local_2fd8;
  param_arg_handler_t local_2fd0;
  allocator<char> local_2fa9;
  string local_2fa8;
  anon_class_8_1_8991fb9c local_2f88;
  param_arg_handler_t local_2f80;
  allocator<char> local_2f59;
  string local_2f58;
  anon_class_8_1_8991fb9c local_2f38;
  bare_arg_handler_t local_2f30;
  allocator<char> local_2f09;
  string local_2f08;
  code *local_2ee8;
  undefined8 local_2ee0;
  param_arg_handler_t local_2ed8;
  code *local_2eb8;
  undefined8 local_2eb0;
  bare_arg_handler_t local_2ea8;
  allocator<char> local_2e81;
  string local_2e80;
  anon_class_8_1_8991fb9c local_2e60;
  param_arg_handler_t local_2e58;
  allocator<char> local_2e31;
  string local_2e30;
  anon_class_8_1_8991fb9c local_2e10;
  param_arg_handler_t local_2e08;
  allocator<char> local_2de1;
  string local_2de0;
  anon_class_8_1_8991fb9c local_2dc0;
  param_arg_handler_t local_2db8;
  allocator<char> local_2d91;
  string local_2d90;
  anon_class_8_1_8991fb9c local_2d70;
  param_arg_handler_t local_2d68;
  allocator<char> local_2d41;
  string local_2d40;
  anon_class_8_1_8991fb9c local_2d20;
  param_arg_handler_t local_2d18;
  allocator<char> local_2cf1;
  string local_2cf0;
  code *local_2cd0;
  undefined8 local_2cc8;
  param_arg_handler_t local_2cc0;
  code *local_2ca0;
  undefined8 local_2c98;
  bare_arg_handler_t local_2c90;
  allocator<char> local_2c69;
  string local_2c68;
  anon_class_8_1_8991fb9c local_2c48;
  param_arg_handler_t local_2c40;
  allocator<char> local_2c19;
  string local_2c18;
  anon_class_8_1_8991fb9c local_2bf8;
  param_arg_handler_t local_2bf0;
  allocator<char> local_2bc9;
  string local_2bc8;
  anon_class_8_1_8991fb9c local_2ba8;
  param_arg_handler_t local_2ba0;
  allocator<char> local_2b79;
  string local_2b78;
  anon_class_8_1_8991fb9c local_2b58;
  param_arg_handler_t local_2b50;
  allocator<char> local_2b29;
  string local_2b28;
  anon_class_8_1_8991fb9c local_2b08;
  param_arg_handler_t local_2b00;
  allocator<char> local_2ad9;
  string local_2ad8;
  anon_class_8_1_8991fb9c local_2ab8;
  param_arg_handler_t local_2ab0;
  allocator<char> local_2a89;
  string local_2a88;
  anon_class_8_1_8991fb9c local_2a68;
  param_arg_handler_t local_2a60;
  allocator<char> local_2a39;
  string local_2a38;
  anon_class_8_1_8991fb9c local_2a18;
  param_arg_handler_t local_2a10;
  allocator<char> local_29e9;
  string local_29e8;
  anon_class_8_1_8991fb9c local_29c8;
  bare_arg_handler_t local_29c0;
  allocator<char> local_2999;
  string local_2998;
  anon_class_8_1_8991fb9c local_2978;
  bare_arg_handler_t local_2970;
  allocator<char> local_2949;
  string local_2948;
  anon_class_8_1_8991fb9c local_2928;
  bare_arg_handler_t local_2920;
  allocator<char> local_28f9;
  string local_28f8;
  code *local_28d8;
  undefined8 local_28d0;
  bare_arg_handler_t local_28c8;
  allocator<char> local_28a1;
  string local_28a0;
  anon_class_8_1_8991fb9c local_2880;
  param_arg_handler_t local_2878;
  allocator<char> local_2851;
  string local_2850;
  anon_class_8_1_8991fb9c local_2830;
  param_arg_handler_t local_2828;
  allocator<char> local_2801;
  string local_2800;
  anon_class_8_1_8991fb9c local_27e0;
  param_arg_handler_t local_27d8;
  allocator<char> local_27b1;
  string local_27b0;
  anon_class_8_1_8991fb9c local_2790;
  param_arg_handler_t local_2788;
  allocator<char> local_2761;
  string local_2760;
  anon_class_8_1_8991fb9c local_2740;
  param_arg_handler_t local_2738;
  allocator<char> local_2711;
  string local_2710;
  anon_class_8_1_8991fb9c local_26f0;
  param_arg_handler_t local_26e8;
  allocator<char> local_26c1;
  string local_26c0;
  anon_class_8_1_8991fb9c local_26a0;
  param_arg_handler_t local_2698;
  allocator<char> local_2671;
  string local_2670;
  anon_class_8_1_8991fb9c local_2650;
  param_arg_handler_t local_2648;
  allocator<char> local_2621;
  string local_2620;
  anon_class_8_1_8991fb9c local_2600;
  param_arg_handler_t local_25f8;
  allocator<char> local_25d1;
  string local_25d0;
  anon_class_8_1_8991fb9c local_25b0;
  bare_arg_handler_t local_25a8;
  allocator<char> local_2581;
  string local_2580;
  anon_class_8_1_8991fb9c local_2560;
  bare_arg_handler_t local_2558;
  allocator<char> local_2531;
  string local_2530;
  code *local_2510;
  undefined8 local_2508;
  bare_arg_handler_t local_2500;
  allocator<char> local_24d9;
  string local_24d8;
  anon_class_8_1_8991fb9c local_24b8;
  param_arg_handler_t local_24b0;
  allocator<char> local_2489;
  string local_2488;
  anon_class_8_1_8991fb9c local_2468;
  param_arg_handler_t local_2460;
  allocator<char> local_2439;
  string local_2438;
  anon_class_8_1_8991fb9c local_2418;
  param_arg_handler_t local_2410;
  allocator<char> local_23e9;
  string local_23e8;
  anon_class_8_1_8991fb9c local_23c8;
  param_arg_handler_t local_23c0;
  allocator<char> local_2399;
  string local_2398;
  code *local_2378;
  undefined8 local_2370;
  bare_arg_handler_t local_2368;
  allocator<char> local_2341;
  string local_2340;
  code *local_2320;
  undefined8 local_2318;
  param_arg_handler_t local_2310;
  allocator<char> local_22e9;
  string local_22e8;
  code *local_22c8;
  undefined8 local_22c0;
  param_arg_handler_t local_22b8;
  allocator<char> local_2291;
  string local_2290;
  code *local_2270;
  undefined8 local_2268;
  param_arg_handler_t local_2260;
  allocator<char> local_2239;
  string local_2238;
  code *local_2218;
  undefined8 local_2210;
  param_arg_handler_t local_2208;
  code *local_21e8;
  undefined8 local_21e0;
  bare_arg_handler_t local_21d8;
  allocator<char> local_21b1;
  string local_21b0;
  anon_class_8_1_8991fb9c local_2190;
  param_arg_handler_t local_2188;
  allocator<char> local_2161;
  string local_2160;
  anon_class_8_1_8991fb9c local_2140;
  param_arg_handler_t local_2138;
  allocator<char> local_2111;
  string local_2110;
  anon_class_8_1_8991fb9c local_20f0;
  param_arg_handler_t local_20e8;
  allocator<char> local_20c1;
  string local_20c0;
  code *local_20a0;
  undefined8 local_2098;
  param_arg_handler_t local_2090;
  code *local_2070;
  undefined8 local_2068;
  bare_arg_handler_t local_2060;
  allocator<char> local_2039;
  string local_2038;
  anon_class_8_1_8991fb9c local_2018;
  param_arg_handler_t local_2010;
  allocator<char> local_1fe9;
  string local_1fe8;
  anon_class_8_1_8991fb9c local_1fc8;
  param_arg_handler_t local_1fc0;
  allocator<char> local_1f99;
  string local_1f98;
  anon_class_8_1_8991fb9c local_1f78;
  param_arg_handler_t local_1f70;
  allocator<char> local_1f49;
  string local_1f48;
  anon_class_8_1_8991fb9c local_1f28;
  param_arg_handler_t local_1f20;
  allocator<char> local_1ef9;
  string local_1ef8;
  anon_class_8_1_8991fb9c local_1ed8;
  param_arg_handler_t local_1ed0;
  allocator<char> local_1ea9;
  string local_1ea8;
  anon_class_8_1_8991fb9c local_1e88;
  param_arg_handler_t local_1e80;
  allocator<char> local_1e59;
  string local_1e58;
  anon_class_8_1_8991fb9c local_1e38;
  param_arg_handler_t local_1e30;
  allocator<char> local_1e09;
  string local_1e08;
  anon_class_8_1_8991fb9c local_1de8;
  param_arg_handler_t local_1de0;
  allocator<char> local_1db9;
  string local_1db8;
  anon_class_8_1_8991fb9c local_1d98;
  param_arg_handler_t local_1d90;
  allocator<char> local_1d69;
  string local_1d68;
  anon_class_8_1_8991fb9c local_1d48;
  param_arg_handler_t local_1d40;
  allocator<char> local_1d19;
  string local_1d18;
  anon_class_8_1_8991fb9c local_1cf8;
  param_arg_handler_t local_1cf0;
  allocator<char> local_1cc9;
  string local_1cc8;
  anon_class_8_1_8991fb9c local_1ca8;
  param_arg_handler_t local_1ca0;
  allocator<char> local_1c79;
  string local_1c78;
  anon_class_8_1_8991fb9c local_1c58;
  param_arg_handler_t local_1c50;
  allocator<char> local_1c29;
  string local_1c28;
  anon_class_8_1_8991fb9c local_1c08;
  param_arg_handler_t local_1c00;
  allocator<char> local_1bd9;
  string local_1bd8;
  anon_class_8_1_8991fb9c local_1bb8;
  param_arg_handler_t local_1bb0;
  allocator<char> local_1b89;
  string local_1b88;
  anon_class_8_1_8991fb9c local_1b68;
  param_arg_handler_t local_1b60;
  allocator<char> local_1b39;
  string local_1b38;
  anon_class_8_1_8991fb9c local_1b18;
  param_arg_handler_t local_1b10;
  allocator<char> local_1ae9;
  string local_1ae8;
  anon_class_8_1_8991fb9c local_1ac8;
  param_arg_handler_t local_1ac0;
  allocator<char> local_1a99;
  string local_1a98;
  anon_class_8_1_8991fb9c local_1a78;
  param_arg_handler_t local_1a70;
  allocator<char> local_1a49;
  string local_1a48;
  anon_class_8_1_8991fb9c local_1a28;
  param_arg_handler_t local_1a20;
  allocator<char> local_19f9;
  string local_19f8;
  anon_class_8_1_8991fb9c local_19d8;
  param_arg_handler_t local_19d0;
  allocator<char> local_19a9;
  string local_19a8;
  anon_class_8_1_8991fb9c local_1988;
  param_arg_handler_t local_1980;
  allocator<char> local_1959;
  string local_1958;
  anon_class_8_1_8991fb9c local_1938;
  param_arg_handler_t local_1930;
  allocator<char> local_1909;
  string local_1908;
  anon_class_8_1_8991fb9c local_18e8;
  param_arg_handler_t local_18e0;
  allocator<char> local_18b9;
  string local_18b8;
  anon_class_8_1_8991fb9c local_1898;
  param_arg_handler_t local_1890;
  allocator<char> local_1869;
  string local_1868;
  anon_class_8_1_8991fb9c local_1848;
  param_arg_handler_t local_1840;
  allocator<char> local_1819;
  string local_1818;
  anon_class_8_1_8991fb9c local_17f8;
  param_arg_handler_t local_17f0;
  allocator<char> local_17c9;
  string local_17c8;
  anon_class_8_1_8991fb9c local_17a8;
  param_arg_handler_t local_17a0;
  allocator<char> local_1779;
  string local_1778;
  anon_class_8_1_8991fb9c local_1758;
  param_arg_handler_t local_1750;
  allocator<char> local_1729;
  string local_1728;
  anon_class_8_1_8991fb9c local_1708;
  param_arg_handler_t local_1700;
  allocator<char> local_16d9;
  string local_16d8;
  anon_class_8_1_8991fb9c local_16b8;
  param_arg_handler_t local_16b0;
  allocator<char> local_1689;
  string local_1688;
  anon_class_8_1_8991fb9c local_1668;
  param_arg_handler_t local_1660;
  allocator<char> local_1639;
  string local_1638;
  anon_class_8_1_8991fb9c local_1618;
  param_arg_handler_t local_1610;
  allocator<char> local_15e9;
  string local_15e8;
  anon_class_8_1_8991fb9c local_15c8;
  param_arg_handler_t local_15c0;
  allocator<char> local_1599;
  string local_1598;
  anon_class_8_1_8991fb9c local_1578;
  param_arg_handler_t local_1570;
  allocator<char> local_1549;
  string local_1548;
  anon_class_8_1_8991fb9c local_1528;
  param_arg_handler_t local_1520;
  allocator<char> local_14f9;
  string local_14f8;
  anon_class_8_1_8991fb9c local_14d8;
  param_arg_handler_t local_14d0;
  allocator<char> local_14a9;
  string local_14a8;
  anon_class_8_1_8991fb9c local_1488;
  bare_arg_handler_t local_1480;
  allocator<char> local_1459;
  string local_1458;
  anon_class_8_1_8991fb9c local_1438;
  bare_arg_handler_t local_1430;
  allocator<char> local_1409;
  string local_1408;
  anon_class_8_1_8991fb9c local_13e8;
  bare_arg_handler_t local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  code *local_1398;
  undefined8 local_1390;
  bare_arg_handler_t local_1388;
  allocator<char> local_1361;
  string local_1360;
  anon_class_8_1_8991fb9c local_1340;
  bare_arg_handler_t local_1338;
  allocator<char> local_1311;
  string local_1310;
  anon_class_8_1_8991fb9c local_12f0;
  bare_arg_handler_t local_12e8;
  allocator<char> local_12c1;
  string local_12c0;
  anon_class_8_1_8991fb9c local_12a0;
  bare_arg_handler_t local_1298;
  allocator<char> local_1271;
  string local_1270;
  anon_class_8_1_8991fb9c local_1250;
  bare_arg_handler_t local_1248;
  allocator<char> local_1221;
  string local_1220;
  anon_class_8_1_8991fb9c local_1200;
  bare_arg_handler_t local_11f8;
  allocator<char> local_11d1;
  string local_11d0;
  anon_class_8_1_8991fb9c local_11b0;
  bare_arg_handler_t local_11a8;
  allocator<char> local_1181;
  string local_1180;
  anon_class_8_1_8991fb9c local_1160;
  bare_arg_handler_t local_1158;
  allocator<char> local_1131;
  string local_1130;
  anon_class_8_1_8991fb9c local_1110;
  bare_arg_handler_t local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  anon_class_8_1_8991fb9c local_10c0;
  bare_arg_handler_t local_10b8;
  allocator<char> local_1091;
  string local_1090;
  anon_class_8_1_8991fb9c local_1070;
  bare_arg_handler_t local_1068;
  allocator<char> local_1041;
  string local_1040;
  anon_class_8_1_8991fb9c local_1020;
  bare_arg_handler_t local_1018;
  allocator<char> local_ff1;
  string local_ff0;
  code *local_fd0;
  undefined8 local_fc8;
  bare_arg_handler_t local_fc0;
  allocator<char> local_f99;
  string local_f98;
  anon_class_8_1_8991fb9c local_f78;
  bare_arg_handler_t local_f70;
  allocator<char> local_f49;
  string local_f48;
  anon_class_8_1_8991fb9c local_f28;
  bare_arg_handler_t local_f20;
  allocator<char> local_ef9;
  string local_ef8;
  anon_class_8_1_8991fb9c local_ed8;
  bare_arg_handler_t local_ed0;
  allocator<char> local_ea9;
  string local_ea8;
  code *local_e88;
  undefined8 local_e80;
  bare_arg_handler_t local_e78;
  allocator<char> local_e51;
  string local_e50;
  anon_class_8_1_8991fb9c local_e30;
  bare_arg_handler_t local_e28;
  allocator<char> local_e01;
  string local_e00;
  anon_class_8_1_8991fb9c local_de0;
  bare_arg_handler_t local_dd8;
  allocator<char> local_db1;
  string local_db0;
  anon_class_8_1_8991fb9c local_d90;
  bare_arg_handler_t local_d88;
  allocator<char> local_d61;
  string local_d60;
  anon_class_8_1_8991fb9c local_d40;
  bare_arg_handler_t local_d38;
  allocator<char> local_d11;
  string local_d10;
  anon_class_8_1_8991fb9c local_cf0;
  bare_arg_handler_t local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  anon_class_8_1_8991fb9c local_ca0;
  bare_arg_handler_t local_c98;
  allocator<char> local_c71;
  string local_c70;
  anon_class_8_1_8991fb9c local_c50;
  bare_arg_handler_t local_c48;
  allocator<char> local_c21;
  string local_c20;
  anon_class_8_1_8991fb9c local_c00;
  bare_arg_handler_t local_bf8;
  allocator<char> local_bd1;
  string local_bd0;
  anon_class_8_1_8991fb9c local_bb0;
  bare_arg_handler_t local_ba8;
  allocator<char> local_b81;
  string local_b80;
  anon_class_8_1_8991fb9c local_b60;
  bare_arg_handler_t local_b58;
  allocator<char> local_b31;
  string local_b30;
  anon_class_8_1_8991fb9c local_b10;
  bare_arg_handler_t local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  code *local_ac0;
  undefined8 local_ab8;
  bare_arg_handler_t local_ab0;
  allocator<char> local_a89;
  string local_a88;
  code *local_a68;
  undefined8 local_a60;
  bare_arg_handler_t local_a58;
  allocator<char> local_a31;
  string local_a30;
  anon_class_8_1_8991fb9c local_a10;
  bare_arg_handler_t local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  anon_class_8_1_8991fb9c local_9c0;
  bare_arg_handler_t local_9b8;
  allocator<char> local_991;
  string local_990;
  anon_class_8_1_8991fb9c local_970;
  bare_arg_handler_t local_968;
  allocator<char> local_941;
  string local_940;
  anon_class_8_1_8991fb9c local_920;
  bare_arg_handler_t local_918;
  allocator<char> local_8f1;
  string local_8f0;
  anon_class_8_1_8991fb9c local_8d0;
  bare_arg_handler_t local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  anon_class_8_1_8991fb9c local_880;
  bare_arg_handler_t local_878;
  allocator<char> local_851;
  string local_850;
  anon_class_8_1_8991fb9c local_830;
  bare_arg_handler_t local_828;
  allocator<char> local_801;
  string local_800;
  anon_class_8_1_8991fb9c local_7e0;
  bare_arg_handler_t local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  anon_class_8_1_8991fb9c local_790;
  bare_arg_handler_t local_788;
  allocator<char> local_761;
  string local_760;
  anon_class_8_1_8991fb9c local_740;
  bare_arg_handler_t local_738;
  allocator<char> local_711;
  string local_710;
  anon_class_8_1_8991fb9c local_6f0;
  bare_arg_handler_t local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  anon_class_8_1_8991fb9c local_6a0;
  bare_arg_handler_t local_698;
  allocator<char> local_671;
  string local_670;
  anon_class_8_1_8991fb9c local_650;
  bare_arg_handler_t local_648;
  allocator<char> local_621;
  string local_620;
  anon_class_8_1_8991fb9c local_600;
  bare_arg_handler_t local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  code *local_5b0;
  undefined8 local_5a8;
  bare_arg_handler_t local_5a0;
  allocator<char> local_579;
  string local_578;
  code *local_558;
  undefined8 local_550;
  bare_arg_handler_t local_548;
  allocator<char> local_521;
  string local_520;
  anon_class_8_1_8991fb9c local_500;
  bare_arg_handler_t local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  anon_class_8_1_8991fb9c local_4b0;
  bare_arg_handler_t local_4a8;
  allocator<char> local_481;
  string local_480;
  code *local_460;
  undefined8 local_458;
  bare_arg_handler_t local_450;
  allocator<char> local_429;
  string local_428;
  anon_class_8_1_8991fb9c local_408;
  bare_arg_handler_t local_400;
  allocator<char> local_3d9;
  string local_3d8;
  anon_class_8_1_8991fb9c local_3b8;
  bare_arg_handler_t local_3b0;
  allocator<char> local_389;
  string local_388;
  anon_class_8_1_8991fb9c local_368;
  bare_arg_handler_t local_360;
  allocator<char> local_339;
  string local_338;
  anon_class_8_1_8991fb9c local_318;
  bare_arg_handler_t local_310;
  allocator<char> local_2e9;
  string local_2e8;
  code *local_2c8;
  undefined8 local_2c0;
  bare_arg_handler_t local_2b8;
  allocator<char> local_291;
  string local_290;
  code *local_270;
  undefined8 local_268;
  param_arg_handler_t local_260;
  code *local_240;
  undefined8 local_238;
  param_arg_handler_t local_230;
  allocator<char> local_209;
  string local_208;
  code *local_1e8;
  undefined8 local_1e0;
  bare_arg_handler_t local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  code *local_190;
  undefined8 local_188;
  bare_arg_handler_t local_180;
  allocator<char> local_159;
  string local_158;
  code *local_138;
  undefined8 local_130;
  bare_arg_handler_t local_128;
  allocator<char> local_101;
  string local_100;
  code *local_e0;
  undefined8 local_d8;
  bare_arg_handler_t local_d0;
  allocator<char> local_a9;
  string local_a8;
  code *local_88;
  undefined8 local_80;
  bare_arg_handler_t local_78;
  allocator<char> local_41;
  string local_40;
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c p;
  anon_class_8_1_8991fb9c b;
  ArgParser *this_local;
  
  local_20.this = this;
  p.this = this;
  QPDFArgParser::selectHelpOptionTable(&this->ap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"version",&local_41);
  local_88 = argVersion;
  local_80 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_78,&p,0x241730);
  QPDFArgParser::addBare(&this->ap,&local_40,&local_78);
  std::function<void_()>::~function(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"copyright",&local_a9);
  local_e0 = argCopyright;
  local_d8 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_d0,&p,0x241890);
  QPDFArgParser::addBare(&this->ap,&local_a8,&local_d0);
  std::function<void_()>::~function(&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"show-crypto",&local_101);
  local_138 = argShowCrypto;
  local_130 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_128,&p,0x241bf0);
  QPDFArgParser::addBare(&this->ap,&local_100,&local_128);
  std::function<void_()>::~function(&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"job-json-help",&local_159);
  local_190 = argJobJsonHelp;
  local_188 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_180,&p,0x241e60);
  QPDFArgParser::addBare(&this->ap,&local_158,&local_180);
  std::function<void_()>::~function(&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"zopfli",&local_1b1);
  local_1e8 = argZopfli;
  local_1e0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1d8,&p,0x241f50);
  QPDFArgParser::addBare(&this->ap,&local_1b0,&local_1d8);
  std::function<void_()>::~function(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"json-help",&local_209);
  local_240 = argJsonHelp;
  local_238 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_230,&local_20,0x242110);
  QPDFArgParser::addChoices
            (&this->ap,&local_208,&local_230,false,initOptionTables::json_version_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  local_270 = argPositional;
  local_268 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_260,&local_20,0x242330);
  QPDFArgParser::addPositional(&this->ap,&local_260);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"add-attachment",&local_291);
  local_2c8 = argAddAttachment;
  local_2c0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2b8,&p,0x242410);
  QPDFArgParser::addBare(&this->ap,&local_290,&local_2b8);
  std::function<void_()>::~function(&local_2b8);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"allow-weak-crypto",&local_2e9);
  local_318.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__0,void>
            ((function<void()> *)&local_310,&local_318);
  QPDFArgParser::addBare(&this->ap,&local_2e8,&local_310);
  std::function<void_()>::~function(&local_310);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"check",&local_339);
  local_368.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__1,void>
            ((function<void()> *)&local_360,&local_368);
  QPDFArgParser::addBare(&this->ap,&local_338,&local_360);
  std::function<void_()>::~function(&local_360);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"check-linearization",&local_389);
  local_3b8.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__2,void>
            ((function<void()> *)&local_3b0,&local_3b8);
  QPDFArgParser::addBare(&this->ap,&local_388,&local_3b0);
  std::function<void_()>::~function(&local_3b0);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"coalesce-contents",&local_3d9);
  local_408.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__3,void>
            ((function<void()> *)&local_400,&local_408);
  QPDFArgParser::addBare(&this->ap,&local_3d8,&local_400);
  std::function<void_()>::~function(&local_400);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"copy-attachments-from",&local_429);
  local_460 = argCopyAttachmentsFrom;
  local_458 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_450,&p,0x242720);
  QPDFArgParser::addBare(&this->ap,&local_428,&local_450);
  std::function<void_()>::~function(&local_450);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"decrypt",&local_481);
  local_4b0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__4,void>
            ((function<void()> *)&local_4a8,&local_4b0);
  QPDFArgParser::addBare(&this->ap,&local_480,&local_4a8);
  std::function<void_()>::~function(&local_4a8);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"deterministic-id",&local_4d1);
  local_500.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__5,void>
            ((function<void()> *)&local_4f8,&local_500);
  QPDFArgParser::addBare(&this->ap,&local_4d0,&local_4f8);
  std::function<void_()>::~function(&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"empty",&local_521);
  local_558 = argEmpty;
  local_550 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_548,&p,0x242910);
  QPDFArgParser::addBare(&this->ap,&local_520,&local_548);
  std::function<void_()>::~function(&local_548);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"encrypt",&local_579);
  local_5b0 = argEncrypt;
  local_5a8 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_5a0,&p,0x242950);
  QPDFArgParser::addBare(&this->ap,&local_578,&local_5a0);
  std::function<void_()>::~function(&local_5a0);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"externalize-inline-images",&local_5d1);
  local_600.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__6,void>
            ((function<void()> *)&local_5f8,&local_600);
  QPDFArgParser::addBare(&this->ap,&local_5d0,&local_5f8);
  std::function<void_()>::~function(&local_5f8);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"filtered-stream-data",&local_621);
  local_650.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__7,void>
            ((function<void()> *)&local_648,&local_650);
  QPDFArgParser::addBare(&this->ap,&local_620,&local_648);
  std::function<void_()>::~function(&local_648);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"flatten-rotation",&local_671);
  local_6a0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__8,void>
            ((function<void()> *)&local_698,&local_6a0);
  QPDFArgParser::addBare(&this->ap,&local_670,&local_698);
  std::function<void_()>::~function(&local_698);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"generate-appearances",&local_6c1);
  local_6f0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__9,void>
            ((function<void()> *)&local_6e8,&local_6f0);
  QPDFArgParser::addBare(&this->ap,&local_6c0,&local_6e8);
  std::function<void_()>::~function(&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"ignore-xref-streams",&local_711);
  local_740.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__10,void>
            ((function<void()> *)&local_738,&local_740);
  QPDFArgParser::addBare(&this->ap,&local_710,&local_738);
  std::function<void_()>::~function(&local_738);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"is-encrypted",&local_761)
  ;
  local_790.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__11,void>
            ((function<void()> *)&local_788,&local_790);
  QPDFArgParser::addBare(&this->ap,&local_760,&local_788);
  std::function<void_()>::~function(&local_788);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"json-input",&local_7b1);
  local_7e0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__12,void>
            ((function<void()> *)&local_7d8,&local_7e0);
  QPDFArgParser::addBare(&this->ap,&local_7b0,&local_7d8);
  std::function<void_()>::~function(&local_7d8);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"keep-inline-images",&local_801);
  local_830.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__13,void>
            ((function<void()> *)&local_828,&local_830);
  QPDFArgParser::addBare(&this->ap,&local_800,&local_828);
  std::function<void_()>::~function(&local_828);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"linearize",&local_851);
  local_880.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__14,void>
            ((function<void()> *)&local_878,&local_880);
  QPDFArgParser::addBare(&this->ap,&local_850,&local_878);
  std::function<void_()>::~function(&local_878);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"list-attachments",&local_8a1);
  local_8d0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__15,void>
            ((function<void()> *)&local_8c8,&local_8d0);
  QPDFArgParser::addBare(&this->ap,&local_8a0,&local_8c8);
  std::function<void_()>::~function(&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"newline-before-endstream",&local_8f1);
  local_920.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__16,void>
            ((function<void()> *)&local_918,&local_920);
  QPDFArgParser::addBare(&this->ap,&local_8f0,&local_918);
  std::function<void_()>::~function(&local_918);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"no-original-object-ids",&local_941);
  local_970.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__17,void>
            ((function<void()> *)&local_968,&local_970);
  QPDFArgParser::addBare(&this->ap,&local_940,&local_968);
  std::function<void_()>::~function(&local_968);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"no-warn",&local_991);
  local_9c0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__18,void>
            ((function<void()> *)&local_9b8,&local_9c0);
  QPDFArgParser::addBare(&this->ap,&local_990,&local_9b8);
  std::function<void_()>::~function(&local_9b8);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,"optimize-images",&local_9e1);
  local_a10.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__19,void>
            ((function<void()> *)&local_a08,&local_a10);
  QPDFArgParser::addBare(&this->ap,&local_9e0,&local_a08);
  std::function<void_()>::~function(&local_a08);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"overlay",&local_a31);
  local_a68 = argOverlay;
  local_a60 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_a58,&p,0x243320);
  QPDFArgParser::addBare(&this->ap,&local_a30,&local_a58);
  std::function<void_()>::~function(&local_a58);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"pages",&local_a89);
  local_ac0 = argPages;
  local_ab8 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_ab0,&p,0x2433f0);
  QPDFArgParser::addBare(&this->ap,&local_a88,&local_ab0);
  std::function<void_()>::~function(&local_ab0);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae0,"password-is-hex-key",&local_ae1);
  local_b10.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__20,void>
            ((function<void()> *)&local_b08,&local_b10);
  QPDFArgParser::addBare(&this->ap,&local_ae0,&local_b08);
  std::function<void_()>::~function(&local_b08);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,"preserve-unreferenced",&local_b31);
  local_b60.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__21,void>
            ((function<void()> *)&local_b58,&local_b60);
  QPDFArgParser::addBare(&this->ap,&local_b30,&local_b58);
  std::function<void_()>::~function(&local_b58);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b80,"preserve-unreferenced-resources",&local_b81);
  local_bb0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__22,void>
            ((function<void()> *)&local_ba8,&local_bb0);
  QPDFArgParser::addBare(&this->ap,&local_b80,&local_ba8);
  std::function<void_()>::~function(&local_ba8);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd0,"progress",&local_bd1);
  local_c00.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__23,void>
            ((function<void()> *)&local_bf8,&local_c00);
  QPDFArgParser::addBare(&this->ap,&local_bd0,&local_bf8);
  std::function<void_()>::~function(&local_bf8);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"qdf",&local_c21);
  local_c50.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__24,void>
            ((function<void()> *)&local_c48,&local_c50);
  QPDFArgParser::addBare(&this->ap,&local_c20,&local_c48);
  std::function<void_()>::~function(&local_c48);
  std::__cxx11::string::~string((string *)&local_c20);
  std::allocator<char>::~allocator(&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c70,"raw-stream-data",&local_c71);
  local_ca0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__25,void>
            ((function<void()> *)&local_c98,&local_ca0);
  QPDFArgParser::addBare(&this->ap,&local_c70,&local_c98);
  std::function<void_()>::~function(&local_c98);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cc0,"recompress-flate",&local_cc1);
  local_cf0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__26,void>
            ((function<void()> *)&local_ce8,&local_cf0);
  QPDFArgParser::addBare(&this->ap,&local_cc0,&local_ce8);
  std::function<void_()>::~function(&local_ce8);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d10,"remove-info",&local_d11);
  local_d40.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__27,void>
            ((function<void()> *)&local_d38,&local_d40);
  QPDFArgParser::addBare(&this->ap,&local_d10,&local_d38);
  std::function<void_()>::~function(&local_d38);
  std::__cxx11::string::~string((string *)&local_d10);
  std::allocator<char>::~allocator(&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d60,"remove-metadata",&local_d61);
  local_d90.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__28,void>
            ((function<void()> *)&local_d88,&local_d90);
  QPDFArgParser::addBare(&this->ap,&local_d60,&local_d88);
  std::function<void_()>::~function(&local_d88);
  std::__cxx11::string::~string((string *)&local_d60);
  std::allocator<char>::~allocator(&local_d61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_db0,"remove-page-labels",&local_db1);
  local_de0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__29,void>
            ((function<void()> *)&local_dd8,&local_de0);
  QPDFArgParser::addBare(&this->ap,&local_db0,&local_dd8);
  std::function<void_()>::~function(&local_dd8);
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator(&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e00,"remove-structure",&local_e01);
  local_e30.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__30,void>
            ((function<void()> *)&local_e28,&local_e30);
  QPDFArgParser::addBare(&this->ap,&local_e00,&local_e28);
  std::function<void_()>::~function(&local_e28);
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator(&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e50,"replace-input",&local_e51);
  local_e88 = argReplaceInput;
  local_e80 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_e78,&p,0x243b00);
  QPDFArgParser::addBare(&this->ap,&local_e50,&local_e78);
  std::function<void_()>::~function(&local_e78);
  std::__cxx11::string::~string((string *)&local_e50);
  std::allocator<char>::~allocator(&local_e51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ea8,"report-memory-usage",&local_ea9);
  local_ed8.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__31,void>
            ((function<void()> *)&local_ed0,&local_ed8);
  QPDFArgParser::addBare(&this->ap,&local_ea8,&local_ed0);
  std::function<void_()>::~function(&local_ed0);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::allocator<char>::~allocator(&local_ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ef8,"requires-password",&local_ef9);
  local_f28.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__32,void>
            ((function<void()> *)&local_f20,&local_f28);
  QPDFArgParser::addBare(&this->ap,&local_ef8,&local_f20);
  std::function<void_()>::~function(&local_f20);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::allocator<char>::~allocator(&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"remove-restrictions",&local_f49);
  local_f78.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__33,void>
            ((function<void()> *)&local_f70,&local_f78);
  QPDFArgParser::addBare(&this->ap,&local_f48,&local_f70);
  std::function<void_()>::~function(&local_f70);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator(&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f98,"set-page-labels",&local_f99);
  local_fd0 = argSetPageLabels;
  local_fc8 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_fc0,&p,0x243cf0);
  QPDFArgParser::addBare(&this->ap,&local_f98,&local_fc0);
  std::function<void_()>::~function(&local_fc0);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff0,"show-encryption",&local_ff1);
  local_1020.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__34,void>
            ((function<void()> *)&local_1018,&local_1020);
  QPDFArgParser::addBare(&this->ap,&local_ff0,&local_1018);
  std::function<void_()>::~function(&local_1018);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1040,"show-encryption-key",&local_1041);
  local_1070.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__35,void>
            ((function<void()> *)&local_1068,&local_1070);
  QPDFArgParser::addBare(&this->ap,&local_1040,&local_1068);
  std::function<void_()>::~function(&local_1068);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator(&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1090,"show-linearization",&local_1091);
  local_10c0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__36,void>
            ((function<void()> *)&local_10b8,&local_10c0);
  QPDFArgParser::addBare(&this->ap,&local_1090,&local_10b8);
  std::function<void_()>::~function(&local_10b8);
  std::__cxx11::string::~string((string *)&local_1090);
  std::allocator<char>::~allocator(&local_1091);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10e0,"show-npages",&local_10e1);
  local_1110.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__37,void>
            ((function<void()> *)&local_1108,&local_1110);
  QPDFArgParser::addBare(&this->ap,&local_10e0,&local_1108);
  std::function<void_()>::~function(&local_1108);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::allocator<char>::~allocator(&local_10e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1130,"show-pages",&local_1131)
  ;
  local_1160.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__38,void>
            ((function<void()> *)&local_1158,&local_1160);
  QPDFArgParser::addBare(&this->ap,&local_1130,&local_1158);
  std::function<void_()>::~function(&local_1158);
  std::__cxx11::string::~string((string *)&local_1130);
  std::allocator<char>::~allocator(&local_1131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1180,"show-xref",&local_1181);
  local_11b0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__39,void>
            ((function<void()> *)&local_11a8,&local_11b0);
  QPDFArgParser::addBare(&this->ap,&local_1180,&local_11a8);
  std::function<void_()>::~function(&local_11a8);
  std::__cxx11::string::~string((string *)&local_1180);
  std::allocator<char>::~allocator(&local_1181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d0,"static-aes-iv",&local_11d1);
  local_1200.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__40,void>
            ((function<void()> *)&local_11f8,&local_1200);
  QPDFArgParser::addBare(&this->ap,&local_11d0,&local_11f8);
  std::function<void_()>::~function(&local_11f8);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::allocator<char>::~allocator(&local_11d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1220,"static-id",&local_1221);
  local_1250.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__41,void>
            ((function<void()> *)&local_1248,&local_1250);
  QPDFArgParser::addBare(&this->ap,&local_1220,&local_1248);
  std::function<void_()>::~function(&local_1248);
  std::__cxx11::string::~string((string *)&local_1220);
  std::allocator<char>::~allocator(&local_1221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1270,"suppress-password-recovery",&local_1271);
  local_12a0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__42,void>
            ((function<void()> *)&local_1298,&local_12a0);
  QPDFArgParser::addBare(&this->ap,&local_1270,&local_1298);
  std::function<void_()>::~function(&local_1298);
  std::__cxx11::string::~string((string *)&local_1270);
  std::allocator<char>::~allocator(&local_1271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12c0,"suppress-recovery",&local_12c1);
  local_12f0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__43,void>
            ((function<void()> *)&local_12e8,&local_12f0);
  QPDFArgParser::addBare(&this->ap,&local_12c0,&local_12e8);
  std::function<void_()>::~function(&local_12e8);
  std::__cxx11::string::~string((string *)&local_12c0);
  std::allocator<char>::~allocator(&local_12c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1310,"test-json-schema",&local_1311);
  local_1340.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__44,void>
            ((function<void()> *)&local_1338,&local_1340);
  QPDFArgParser::addBare(&this->ap,&local_1310,&local_1338);
  std::function<void_()>::~function(&local_1338);
  std::__cxx11::string::~string((string *)&local_1310);
  std::allocator<char>::~allocator(&local_1311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1360,"underlay",&local_1361);
  local_1398 = argUnderlay;
  local_1390 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1388,&p,0x2443d0);
  QPDFArgParser::addBare(&this->ap,&local_1360,&local_1388);
  std::function<void_()>::~function(&local_1388);
  std::__cxx11::string::~string((string *)&local_1360);
  std::allocator<char>::~allocator(&local_1361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13b8,"verbose",&local_13b9);
  local_13e8.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__45,void>
            ((function<void()> *)&local_13e0,&local_13e8);
  QPDFArgParser::addBare(&this->ap,&local_13b8,&local_13e0);
  std::function<void_()>::~function(&local_13e0);
  std::__cxx11::string::~string((string *)&local_13b8);
  std::allocator<char>::~allocator(&local_13b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1408,"warning-exit-0",&local_1409);
  local_1438.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__46,void>
            ((function<void()> *)&local_1430,&local_1438);
  QPDFArgParser::addBare(&this->ap,&local_1408,&local_1430);
  std::function<void_()>::~function(&local_1430);
  std::__cxx11::string::~string((string *)&local_1408);
  std::allocator<char>::~allocator(&local_1409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1458,"with-images",&local_1459);
  local_1488.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__47,void>
            ((function<void()> *)&local_1480,&local_1488);
  QPDFArgParser::addBare(&this->ap,&local_1458,&local_1480);
  std::function<void_()>::~function(&local_1480);
  std::__cxx11::string::~string((string *)&local_1458);
  std::allocator<char>::~allocator(&local_1459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14a8,"compression-level",&local_14a9);
  local_14d8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__48,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_14d0,&local_14d8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_14a8,&local_14d0,"level");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_14d0);
  std::__cxx11::string::~string((string *)&local_14a8);
  std::allocator<char>::~allocator(&local_14a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14f8,"jpeg-quality",&local_14f9);
  local_1528.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__49,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1520,&local_1528);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_14f8,&local_1520,"level");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1520);
  std::__cxx11::string::~string((string *)&local_14f8);
  std::allocator<char>::~allocator(&local_14f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1548,"copy-encryption",&local_1549);
  local_1578.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__50,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1570,&local_1578);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1548,&local_1570,"file");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1570);
  std::__cxx11::string::~string((string *)&local_1548);
  std::allocator<char>::~allocator(&local_1549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1598,"encryption-file-password",&local_1599);
  local_15c8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__51,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_15c0,&local_15c8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1598,&local_15c0,"password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_15c0);
  std::__cxx11::string::~string((string *)&local_1598);
  std::allocator<char>::~allocator(&local_1599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15e8,"force-version",&local_15e9);
  local_1618.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__52,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1610,&local_1618);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_15e8,&local_1610,"version");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1610);
  std::__cxx11::string::~string((string *)&local_15e8);
  std::allocator<char>::~allocator(&local_15e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1638,"ii-min-bytes",&local_1639);
  local_1668.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__53,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1660,&local_1668);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1638,&local_1660,"minimum");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1660);
  std::__cxx11::string::~string((string *)&local_1638);
  std::allocator<char>::~allocator(&local_1639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1688,"job-json-file",&local_1689);
  local_16b8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__54,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_16b0,&local_16b8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1688,&local_16b0,"file");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_16b0);
  std::__cxx11::string::~string((string *)&local_1688);
  std::allocator<char>::~allocator(&local_1689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16d8,"json-object",&local_16d9);
  local_1708.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__55,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1700,&local_1708);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_16d8,&local_1700,"trailer");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1700);
  std::__cxx11::string::~string((string *)&local_16d8);
  std::allocator<char>::~allocator(&local_16d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1728,"keep-files-open-threshold",&local_1729);
  local_1758.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__56,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1750,&local_1758);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1728,&local_1750,"count");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1750);
  std::__cxx11::string::~string((string *)&local_1728);
  std::allocator<char>::~allocator(&local_1729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1778,"linearize-pass1",&local_1779);
  local_17a8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__57,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_17a0,&local_17a8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1778,&local_17a0,"filename");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_17a0);
  std::__cxx11::string::~string((string *)&local_1778);
  std::allocator<char>::~allocator(&local_1779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17c8,"min-version",&local_17c9);
  local_17f8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__58,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_17f0,&local_17f8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_17c8,&local_17f0,"version");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_17f0);
  std::__cxx11::string::~string((string *)&local_17c8);
  std::allocator<char>::~allocator(&local_17c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1818,"oi-min-area",&local_1819);
  local_1848.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__59,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1840,&local_1848);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1818,&local_1840,"minimum");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1840);
  std::__cxx11::string::~string((string *)&local_1818);
  std::allocator<char>::~allocator(&local_1819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1868,"oi-min-height",&local_1869);
  local_1898.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__60,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1890,&local_1898);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1868,&local_1890,"minimum");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1890);
  std::__cxx11::string::~string((string *)&local_1868);
  std::allocator<char>::~allocator(&local_1869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18b8,"oi-min-width",&local_18b9);
  local_18e8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__61,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_18e0,&local_18e8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_18b8,&local_18e0,"minimum");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_18e0);
  std::__cxx11::string::~string((string *)&local_18b8);
  std::allocator<char>::~allocator(&local_18b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1908,"password",&local_1909);
  local_1938.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__62,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1930,&local_1938);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1908,&local_1930,"password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1930);
  std::__cxx11::string::~string((string *)&local_1908);
  std::allocator<char>::~allocator(&local_1909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1958,"password-file",&local_1959);
  local_1988.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__63,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1980,&local_1988);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1958,&local_1980,"password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1980);
  std::__cxx11::string::~string((string *)&local_1958);
  std::allocator<char>::~allocator(&local_1959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19a8,"remove-attachment",&local_19a9);
  local_19d8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__64,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_19d0,&local_19d8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_19a8,&local_19d0,"attachment");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_19d0);
  std::__cxx11::string::~string((string *)&local_19a8);
  std::allocator<char>::~allocator(&local_19a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_19f8,"rotate",&local_19f9);
  local_1a28.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__65,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1a20,&local_1a28);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_19f8,&local_1a20,"[+|-]angle");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1a20);
  std::__cxx11::string::~string((string *)&local_19f8);
  std::allocator<char>::~allocator(&local_19f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a48,"show-attachment",&local_1a49);
  local_1a78.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__66,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1a70,&local_1a78);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1a48,&local_1a70,"attachment");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1a70);
  std::__cxx11::string::~string((string *)&local_1a48);
  std::allocator<char>::~allocator(&local_1a49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a98,"show-object",&local_1a99);
  local_1ac8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__67,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1ac0,&local_1ac8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1a98,&local_1ac0,"trailer");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1ac0);
  std::__cxx11::string::~string((string *)&local_1a98);
  std::allocator<char>::~allocator(&local_1a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ae8,"json-stream-prefix",&local_1ae9);
  local_1b18.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__68,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1b10,&local_1b18);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1ae8,&local_1b10,"stream-file-prefix");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b10);
  std::__cxx11::string::~string((string *)&local_1ae8);
  std::allocator<char>::~allocator(&local_1ae9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b38,"update-from-json",&local_1b39);
  local_1b68.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__69,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1b60,&local_1b68);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_1b38,&local_1b60,"qpdf-json file");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b60);
  std::__cxx11::string::~string((string *)&local_1b38);
  std::allocator<char>::~allocator(&local_1b39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b88,"collate",&local_1b89);
  local_1bb8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__70,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1bb0,&local_1bb8);
  QPDFArgParser::addOptionalParameter(&this->ap,&local_1b88,&local_1bb0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1bb0);
  std::__cxx11::string::~string((string *)&local_1b88);
  std::allocator<char>::~allocator(&local_1b89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1bd8,"split-pages",&local_1bd9);
  local_1c08.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__71,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1c00,&local_1c08);
  QPDFArgParser::addOptionalParameter(&this->ap,&local_1bd8,&local_1c00);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1c00);
  std::__cxx11::string::~string((string *)&local_1bd8);
  std::allocator<char>::~allocator(&local_1bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c28,"compress-streams",&local_1c29);
  local_1c58.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__72,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1c50,&local_1c58);
  QPDFArgParser::addChoices(&this->ap,&local_1c28,&local_1c50,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1c50);
  std::__cxx11::string::~string((string *)&local_1c28);
  std::allocator<char>::~allocator(&local_1c29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c78,"decode-level",&local_1c79);
  local_1ca8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__73,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1ca0,&local_1ca8);
  QPDFArgParser::addChoices
            (&this->ap,&local_1c78,&local_1ca0,true,initOptionTables::decode_level_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1ca0);
  std::__cxx11::string::~string((string *)&local_1c78);
  std::allocator<char>::~allocator(&local_1c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1cc8,"flatten-annotations",&local_1cc9);
  local_1cf8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__74,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1cf0,&local_1cf8);
  QPDFArgParser::addChoices
            (&this->ap,&local_1cc8,&local_1cf0,true,initOptionTables::flatten_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1cf0);
  std::__cxx11::string::~string((string *)&local_1cc8);
  std::allocator<char>::~allocator(&local_1cc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d18,"json-key",&local_1d19);
  local_1d48.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__75,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1d40,&local_1d48);
  QPDFArgParser::addChoices
            (&this->ap,&local_1d18,&local_1d40,true,initOptionTables::json_key_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1d40);
  std::__cxx11::string::~string((string *)&local_1d18);
  std::allocator<char>::~allocator(&local_1d19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d68,"json-stream-data",&local_1d69);
  local_1d98.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__76,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1d90,&local_1d98);
  QPDFArgParser::addChoices
            (&this->ap,&local_1d68,&local_1d90,true,initOptionTables::json_stream_data_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1d90);
  std::__cxx11::string::~string((string *)&local_1d68);
  std::allocator<char>::~allocator(&local_1d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1db8,"keep-files-open",&local_1db9);
  local_1de8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__77,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1de0,&local_1de8);
  QPDFArgParser::addChoices(&this->ap,&local_1db8,&local_1de0,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1de0);
  std::__cxx11::string::~string((string *)&local_1db8);
  std::allocator<char>::~allocator(&local_1db9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e08,"normalize-content",&local_1e09);
  local_1e38.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__78,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1e30,&local_1e38);
  QPDFArgParser::addChoices(&this->ap,&local_1e08,&local_1e30,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1e30);
  std::__cxx11::string::~string((string *)&local_1e08);
  std::allocator<char>::~allocator(&local_1e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e58,"object-streams",&local_1e59);
  local_1e88.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__79,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1e80,&local_1e88);
  QPDFArgParser::addChoices
            (&this->ap,&local_1e58,&local_1e80,true,initOptionTables::object_streams_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1e80);
  std::__cxx11::string::~string((string *)&local_1e58);
  std::allocator<char>::~allocator(&local_1e59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ea8,"password-mode",&local_1ea9);
  local_1ed8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__80,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1ed0,&local_1ed8);
  QPDFArgParser::addChoices
            (&this->ap,&local_1ea8,&local_1ed0,true,initOptionTables::password_mode_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1ed0);
  std::__cxx11::string::~string((string *)&local_1ea8);
  std::allocator<char>::~allocator(&local_1ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ef8,"remove-unreferenced-resources",&local_1ef9);
  local_1f28.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__81,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1f20,&local_1f28);
  QPDFArgParser::addChoices
            (&this->ap,&local_1ef8,&local_1f20,true,initOptionTables::remove_unref_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1f20);
  std::__cxx11::string::~string((string *)&local_1ef8);
  std::allocator<char>::~allocator(&local_1ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f48,"stream-data",&local_1f49);
  local_1f78.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__82,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1f70,&local_1f78);
  QPDFArgParser::addChoices
            (&this->ap,&local_1f48,&local_1f70,true,initOptionTables::stream_data_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1f70);
  std::__cxx11::string::~string((string *)&local_1f48);
  std::allocator<char>::~allocator(&local_1f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f98,"json",&local_1f99);
  local_1fc8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__83,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1fc0,&local_1fc8);
  QPDFArgParser::addChoices
            (&this->ap,&local_1f98,&local_1fc0,false,initOptionTables::json_version_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1fc0);
  std::__cxx11::string::~string((string *)&local_1f98);
  std::allocator<char>::~allocator(&local_1f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fe8,"json-output",&local_1fe9);
  local_2018.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__84,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2010,&local_2018);
  QPDFArgParser::addChoices
            (&this->ap,&local_1fe8,&local_2010,false,initOptionTables::json_output_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2010);
  std::__cxx11::string::~string((string *)&local_1fe8);
  std::allocator<char>::~allocator(&local_1fe9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2038,"pages",&local_2039);
  local_2070 = argEndPages;
  local_2068 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2060,&p,0x245b20);
  QPDFArgParser::registerOptionTable(&this->ap,&local_2038,&local_2060);
  std::function<void_()>::~function(&local_2060);
  std::__cxx11::string::~string((string *)&local_2038);
  std::allocator<char>::~allocator(&local_2039);
  local_20a0 = argPagesPositional;
  local_2098 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2090,&local_20,0x245b80);
  QPDFArgParser::addPositional(&this->ap,&local_2090);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2090);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20c0,"file",&local_20c1);
  local_20f0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__85,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_20e8,&local_20f0);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_20c0,&local_20e8,"file");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_20e8);
  std::__cxx11::string::~string((string *)&local_20c0);
  std::allocator<char>::~allocator(&local_20c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2110,"range",&local_2111);
  local_2140.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__86,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2138,&local_2140);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2110,&local_2138,"page-range");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2138);
  std::__cxx11::string::~string((string *)&local_2110);
  std::allocator<char>::~allocator(&local_2111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2160,"password",&local_2161);
  local_2190.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__87,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2188,&local_2190);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2160,&local_2188,"password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2188);
  std::__cxx11::string::~string((string *)&local_2160);
  std::allocator<char>::~allocator(&local_2161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21b0,"encryption",&local_21b1)
  ;
  local_21e8 = argEndEncryption;
  local_21e0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_21d8,&p,0x245f80);
  QPDFArgParser::registerOptionTable(&this->ap,&local_21b0,&local_21d8);
  std::function<void_()>::~function(&local_21d8);
  std::__cxx11::string::~string((string *)&local_21b0);
  std::allocator<char>::~allocator(&local_21b1);
  local_2218 = argEncPositional;
  local_2210 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2208,&local_20,0x245fe0);
  QPDFArgParser::addPositional(&this->ap,&local_2208);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2238,"user-password",&local_2239);
  local_2270 = argEncUserPassword;
  local_2268 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2260,&local_20,0x246160);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2238,&local_2260,"user_password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2260);
  std::__cxx11::string::~string((string *)&local_2238);
  std::allocator<char>::~allocator(&local_2239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2290,"owner-password",&local_2291);
  local_22c8 = argEncOwnerPassword;
  local_22c0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_22b8,&local_20,0x246230);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2290,&local_22b8,"owner_password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_22b8);
  std::__cxx11::string::~string((string *)&local_2290);
  std::allocator<char>::~allocator(&local_2291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22e8,"bits",&local_22e9);
  local_2320 = argEncBits;
  local_2318 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2310,&local_20,0x246300);
  QPDFArgParser::addChoices
            (&this->ap,&local_22e8,&local_2310,true,initOptionTables::enc_bits_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2310);
  std::__cxx11::string::~string((string *)&local_22e8);
  std::allocator<char>::~allocator(&local_22e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2340,"40-bit encryption",&local_2341);
  local_2378 = argEnd40BitEncryption;
  local_2370 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2368,&p,0x246700);
  QPDFArgParser::registerOptionTable(&this->ap,&local_2340,&local_2368);
  std::function<void_()>::~function(&local_2368);
  std::__cxx11::string::~string((string *)&local_2340);
  std::allocator<char>::~allocator(&local_2341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2398,"extract",&local_2399);
  local_23c8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__88,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_23c0,&local_23c8);
  QPDFArgParser::addChoices(&this->ap,&local_2398,&local_23c0,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_23c0);
  std::__cxx11::string::~string((string *)&local_2398);
  std::allocator<char>::~allocator(&local_2399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23e8,"annotate",&local_23e9);
  local_2418.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__89,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2410,&local_2418);
  QPDFArgParser::addChoices(&this->ap,&local_23e8,&local_2410,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2410);
  std::__cxx11::string::~string((string *)&local_23e8);
  std::allocator<char>::~allocator(&local_23e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2438,"print",&local_2439);
  local_2468.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__90,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2460,&local_2468);
  QPDFArgParser::addChoices(&this->ap,&local_2438,&local_2460,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2460);
  std::__cxx11::string::~string((string *)&local_2438);
  std::allocator<char>::~allocator(&local_2439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2488,"modify",&local_2489);
  local_24b8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__91,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_24b0,&local_24b8);
  QPDFArgParser::addChoices(&this->ap,&local_2488,&local_24b0,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_24b0);
  std::__cxx11::string::~string((string *)&local_2488);
  std::allocator<char>::~allocator(&local_2489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24d8,"128-bit encryption",&local_24d9);
  local_2510 = argEnd128BitEncryption;
  local_2508 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2500,&p,0x246960);
  QPDFArgParser::registerOptionTable(&this->ap,&local_24d8,&local_2500);
  std::function<void_()>::~function(&local_2500);
  std::__cxx11::string::~string((string *)&local_24d8);
  std::allocator<char>::~allocator(&local_24d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2530,"cleartext-metadata",&local_2531);
  local_2560.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__92,void>
            ((function<void()> *)&local_2558,&local_2560);
  QPDFArgParser::addBare(&this->ap,&local_2530,&local_2558);
  std::function<void_()>::~function(&local_2558);
  std::__cxx11::string::~string((string *)&local_2530);
  std::allocator<char>::~allocator(&local_2531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2580,"force-V4",&local_2581);
  local_25b0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__93,void>
            ((function<void()> *)&local_25a8,&local_25b0);
  QPDFArgParser::addBare(&this->ap,&local_2580,&local_25a8);
  std::function<void_()>::~function(&local_25a8);
  std::__cxx11::string::~string((string *)&local_2580);
  std::allocator<char>::~allocator(&local_2581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25d0,"accessibility",&local_25d1);
  local_2600.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__94,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_25f8,&local_2600);
  QPDFArgParser::addChoices(&this->ap,&local_25d0,&local_25f8,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_25f8);
  std::__cxx11::string::~string((string *)&local_25d0);
  std::allocator<char>::~allocator(&local_25d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2620,"extract",&local_2621);
  local_2650.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__95,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2648,&local_2650);
  QPDFArgParser::addChoices(&this->ap,&local_2620,&local_2648,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2648);
  std::__cxx11::string::~string((string *)&local_2620);
  std::allocator<char>::~allocator(&local_2621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2670,"print",&local_2671);
  local_26a0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__96,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2698,&local_26a0);
  QPDFArgParser::addChoices
            (&this->ap,&local_2670,&local_2698,true,initOptionTables::print128_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2698);
  std::__cxx11::string::~string((string *)&local_2670);
  std::allocator<char>::~allocator(&local_2671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_26c0,"assemble",&local_26c1);
  local_26f0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__97,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_26e8,&local_26f0);
  QPDFArgParser::addChoices(&this->ap,&local_26c0,&local_26e8,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_26e8);
  std::__cxx11::string::~string((string *)&local_26c0);
  std::allocator<char>::~allocator(&local_26c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2710,"annotate",&local_2711);
  local_2740.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__98,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2738,&local_2740);
  QPDFArgParser::addChoices(&this->ap,&local_2710,&local_2738,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2738);
  std::__cxx11::string::~string((string *)&local_2710);
  std::allocator<char>::~allocator(&local_2711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2760,"form",&local_2761);
  local_2790.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__99,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2788,&local_2790);
  QPDFArgParser::addChoices(&this->ap,&local_2760,&local_2788,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2788);
  std::__cxx11::string::~string((string *)&local_2760);
  std::allocator<char>::~allocator(&local_2761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27b0,"modify-other",&local_27b1);
  local_27e0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__100,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_27d8,&local_27e0);
  QPDFArgParser::addChoices(&this->ap,&local_27b0,&local_27d8,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_27d8);
  std::__cxx11::string::~string((string *)&local_27b0);
  std::allocator<char>::~allocator(&local_27b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2800,"modify",&local_2801);
  local_2830.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__101,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2828,&local_2830);
  QPDFArgParser::addChoices
            (&this->ap,&local_2800,&local_2828,true,initOptionTables::modify128_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2828);
  std::__cxx11::string::~string((string *)&local_2800);
  std::allocator<char>::~allocator(&local_2801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2850,"use-aes",&local_2851);
  local_2880.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__102,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2878,&local_2880);
  QPDFArgParser::addChoices(&this->ap,&local_2850,&local_2878,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2878);
  std::__cxx11::string::~string((string *)&local_2850);
  std::allocator<char>::~allocator(&local_2851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28a0,"256-bit encryption",&local_28a1);
  local_28d8 = argEnd256BitEncryption;
  local_28d0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_28c8,&p,0x246fb0);
  QPDFArgParser::registerOptionTable(&this->ap,&local_28a0,&local_28c8);
  std::function<void_()>::~function(&local_28c8);
  std::__cxx11::string::~string((string *)&local_28a0);
  std::allocator<char>::~allocator(&local_28a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28f8,"cleartext-metadata",&local_28f9);
  local_2928.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__103,void>
            ((function<void()> *)&local_2920,&local_2928);
  QPDFArgParser::addBare(&this->ap,&local_28f8,&local_2920);
  std::function<void_()>::~function(&local_2920);
  std::__cxx11::string::~string((string *)&local_28f8);
  std::allocator<char>::~allocator(&local_28f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2948,"force-R5",&local_2949);
  local_2978.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__104,void>
            ((function<void()> *)&local_2970,&local_2978);
  QPDFArgParser::addBare(&this->ap,&local_2948,&local_2970);
  std::function<void_()>::~function(&local_2970);
  std::__cxx11::string::~string((string *)&local_2948);
  std::allocator<char>::~allocator(&local_2949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2998,"allow-insecure",&local_2999);
  local_29c8.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__105,void>
            ((function<void()> *)&local_29c0,&local_29c8);
  QPDFArgParser::addBare(&this->ap,&local_2998,&local_29c0);
  std::function<void_()>::~function(&local_29c0);
  std::__cxx11::string::~string((string *)&local_2998);
  std::allocator<char>::~allocator(&local_2999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29e8,"accessibility",&local_29e9);
  local_2a18.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__106,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2a10,&local_2a18);
  QPDFArgParser::addChoices(&this->ap,&local_29e8,&local_2a10,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2a10);
  std::__cxx11::string::~string((string *)&local_29e8);
  std::allocator<char>::~allocator(&local_29e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a38,"extract",&local_2a39);
  local_2a68.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__107,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2a60,&local_2a68);
  QPDFArgParser::addChoices(&this->ap,&local_2a38,&local_2a60,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2a60);
  std::__cxx11::string::~string((string *)&local_2a38);
  std::allocator<char>::~allocator(&local_2a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a88,"print",&local_2a89);
  local_2ab8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__108,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2ab0,&local_2ab8);
  QPDFArgParser::addChoices
            (&this->ap,&local_2a88,&local_2ab0,true,initOptionTables::print128_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2ab0);
  std::__cxx11::string::~string((string *)&local_2a88);
  std::allocator<char>::~allocator(&local_2a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2ad8,"assemble",&local_2ad9);
  local_2b08.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__109,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2b00,&local_2b08);
  QPDFArgParser::addChoices(&this->ap,&local_2ad8,&local_2b00,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2b00);
  std::__cxx11::string::~string((string *)&local_2ad8);
  std::allocator<char>::~allocator(&local_2ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b28,"annotate",&local_2b29);
  local_2b58.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__110,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2b50,&local_2b58);
  QPDFArgParser::addChoices(&this->ap,&local_2b28,&local_2b50,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2b50);
  std::__cxx11::string::~string((string *)&local_2b28);
  std::allocator<char>::~allocator(&local_2b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b78,"form",&local_2b79);
  local_2ba8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__111,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2ba0,&local_2ba8);
  QPDFArgParser::addChoices(&this->ap,&local_2b78,&local_2ba0,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2ba0);
  std::__cxx11::string::~string((string *)&local_2b78);
  std::allocator<char>::~allocator(&local_2b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2bc8,"modify-other",&local_2bc9);
  local_2bf8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__112,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2bf0,&local_2bf8);
  QPDFArgParser::addChoices(&this->ap,&local_2bc8,&local_2bf0,true,initOptionTables::yn_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2bf0);
  std::__cxx11::string::~string((string *)&local_2bc8);
  std::allocator<char>::~allocator(&local_2bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c18,"modify",&local_2c19);
  local_2c48.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__113,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2c40,&local_2c48);
  QPDFArgParser::addChoices
            (&this->ap,&local_2c18,&local_2c40,true,initOptionTables::modify128_choices);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2c40);
  std::__cxx11::string::~string((string *)&local_2c18);
  std::allocator<char>::~allocator(&local_2c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c68,"underlay/overlay",&local_2c69);
  local_2ca0 = argEndUnderlayOverlay;
  local_2c98 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2c90,&p,0x247600);
  QPDFArgParser::registerOptionTable(&this->ap,&local_2c68,&local_2c90);
  std::function<void_()>::~function(&local_2c90);
  std::__cxx11::string::~string((string *)&local_2c68);
  std::allocator<char>::~allocator(&local_2c69);
  local_2cd0 = argUOPositional;
  local_2cc8 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2cc0,&local_20,0x247660);
  QPDFArgParser::addPositional(&this->ap,&local_2cc0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2cc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2cf0,"file",&local_2cf1);
  local_2d20.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__114,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2d18,&local_2d20);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2cf0,&local_2d18,"file");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2d18);
  std::__cxx11::string::~string((string *)&local_2cf0);
  std::allocator<char>::~allocator(&local_2cf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d40,"to",&local_2d41);
  local_2d70.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__115,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2d68,&local_2d70);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2d40,&local_2d68,"page-range");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2d68);
  std::__cxx11::string::~string((string *)&local_2d40);
  std::allocator<char>::~allocator(&local_2d41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d90,"from",&local_2d91);
  local_2dc0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__116,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2db8,&local_2dc0);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2d90,&local_2db8,"page-range");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2db8);
  std::__cxx11::string::~string((string *)&local_2d90);
  std::allocator<char>::~allocator(&local_2d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2de0,"repeat",&local_2de1);
  local_2e10.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__117,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2e08,&local_2e10);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2de0,&local_2e08,"page-range");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2e08);
  std::__cxx11::string::~string((string *)&local_2de0);
  std::allocator<char>::~allocator(&local_2de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e30,"password",&local_2e31);
  local_2e60.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__118,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2e58,&local_2e60);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2e30,&local_2e58,"password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2e58);
  std::__cxx11::string::~string((string *)&local_2e30);
  std::allocator<char>::~allocator(&local_2e31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e80,"attachment",&local_2e81)
  ;
  local_2eb8 = argEndAttachment;
  local_2eb0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2ea8,&p,0x247960);
  QPDFArgParser::registerOptionTable(&this->ap,&local_2e80,&local_2ea8);
  std::function<void_()>::~function(&local_2ea8);
  std::__cxx11::string::~string((string *)&local_2e80);
  std::allocator<char>::~allocator(&local_2e81);
  local_2ee8 = argAttPositional;
  local_2ee0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_2ed8,&local_20,0x2479c0);
  QPDFArgParser::addPositional(&this->ap,&local_2ed8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2ed8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f08,"replace",&local_2f09);
  local_2f38.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__119,void>
            ((function<void()> *)&local_2f30,&local_2f38);
  QPDFArgParser::addBare(&this->ap,&local_2f08,&local_2f30);
  std::function<void_()>::~function(&local_2f30);
  std::__cxx11::string::~string((string *)&local_2f08);
  std::allocator<char>::~allocator(&local_2f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f58,"key",&local_2f59);
  local_2f88.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__120,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2f80,&local_2f88);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2f58,&local_2f80,"attachment-key");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2f80);
  std::__cxx11::string::~string((string *)&local_2f58);
  std::allocator<char>::~allocator(&local_2f59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2fa8,"filename",&local_2fa9);
  local_2fd8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__121,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_2fd0,&local_2fd8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2fa8,&local_2fd0,"filename");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2fd0);
  std::__cxx11::string::~string((string *)&local_2fa8);
  std::allocator<char>::~allocator(&local_2fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2ff8,"creationdate",&local_2ff9);
  local_3028.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__122,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_3020,&local_3028);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_2ff8,&local_3020,"creation-date");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3020);
  std::__cxx11::string::~string((string *)&local_2ff8);
  std::allocator<char>::~allocator(&local_2ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3048,"moddate",&local_3049);
  local_3078.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__123,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_3070,&local_3078);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_3048,&local_3070,"modification-date");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3070);
  std::__cxx11::string::~string((string *)&local_3048);
  std::allocator<char>::~allocator(&local_3049);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3098,"mimetype",&local_3099);
  local_30c8.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__124,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_30c0,&local_30c8);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_3098,&local_30c0,"mime/type");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_30c0);
  std::__cxx11::string::~string((string *)&local_3098);
  std::allocator<char>::~allocator(&local_3099);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30e8,"description",&local_30e9);
  local_3118.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__125,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_3110,&local_3118);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_30e8,&local_3110,"description");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3110);
  std::__cxx11::string::~string((string *)&local_30e8);
  std::allocator<char>::~allocator(&local_30e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3138,"copy attachment",&local_3139);
  local_3170 = argEndCopyAttachment;
  local_3168 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_3160,&p,0x247de0);
  QPDFArgParser::registerOptionTable(&this->ap,&local_3138,&local_3160);
  std::function<void_()>::~function(&local_3160);
  std::__cxx11::string::~string((string *)&local_3138);
  std::allocator<char>::~allocator(&local_3139);
  local_31a0 = argCopyAttPositional;
  local_3198 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_3190,&local_20,0x247e40);
  QPDFArgParser::addPositional(&this->ap,&local_3190);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_31c0,"prefix",&local_31c1);
  local_31f0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__126,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_31e8,&local_31f0);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_31c0,&local_31e8,"prefix");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_31e8);
  std::__cxx11::string::~string((string *)&local_31c0);
  std::allocator<char>::~allocator(&local_31c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3210,"password",&local_3211);
  local_3240.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::ArgParser::initOptionTables()::__127,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_3238,&local_3240);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_3210,&local_3238,"password");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3238);
  std::__cxx11::string::~string((string *)&local_3210);
  std::allocator<char>::~allocator(&local_3211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3260,"set page labels",&local_3261);
  local_3298 = argEndSetPageLabels;
  local_3290 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_3288,&p,0x247f90);
  QPDFArgParser::registerOptionTable(&this->ap,&local_3260,&local_3288);
  std::function<void_()>::~function(&local_3288);
  std::__cxx11::string::~string((string *)&local_3260);
  std::allocator<char>::~allocator(&local_3261);
  local_32c8 = argPageLabelsPositional;
  local_32c0 = 0;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_32b8,&local_20,0x247fd0);
  QPDFArgParser::addPositional(&this->ap,&local_32b8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_32b8);
  local_32f0.this = this;
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__128,void>
            ((function<void()> *)&local_32e8,&local_32f0);
  QPDFArgParser::addFinalCheck(&this->ap,&local_32e8);
  std::function<void_()>::~function(&local_32e8);
  add_help(&this->ap);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3310,"--",&local_3311);
  std::function<void()>::function<(anonymous_namespace)::ArgParser::initOptionTables()::__129,void>
            ((function<void()> *)&local_3338,&local_3339);
  QPDFArgParser::addBare(&this->ap,&local_3310,&local_3338);
  std::function<void_()>::~function(&local_3338);
  std::__cxx11::string::~string((string *)&local_3310);
  std::allocator<char>::~allocator(&local_3311);
  return;
}

Assistant:

void
ArgParser::initOptionTables()
{
#include <qpdf/auto_job_init.hh>
    this->ap.addFinalCheck([this]() { c_main->checkConfiguration(); });
    // add_help is defined in auto_job_help.hh
    add_help(this->ap);
    // Special case: ignore -- at the top level. This undocumented behavior is for backward
    // compatibility; it was unintentionally the case prior to 10.6, and some users were relying on
    // it.
    this->ap.selectMainOptionTable();
    this->ap.addBare("--", []() {});
}